

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool __thiscall grammar::has_empty_production(grammar *this,token_t nonterminal)

{
  pointer psVar1;
  pointer psVar2;
  mapped_type *pmVar3;
  bool bVar4;
  bool bVar5;
  strong_t<int,_grammar::token_tag> *sym;
  pointer psVar6;
  bool bVar7;
  key_type local_4;
  
  if (nonterminal.internal_rep < 1) {
    bVar4 = false;
  }
  else {
    pmVar3 = std::
             map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
             ::at(&this->rules,&local_4);
    psVar1 = (pmVar3->
             super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    psVar2 = (pmVar3->
             super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar4 = true;
    do {
      psVar6 = psVar2;
      if (psVar6 == psVar1) goto LAB_0010468b;
      bVar7 = psVar6->internal_rep == 0;
      bVar5 = (bool)(bVar4 & bVar7);
      psVar2 = psVar6 + 1;
      bVar4 = bVar7;
    } while (!bVar5);
    bVar4 = true;
LAB_0010468b:
    bVar4 = (bool)(psVar6 != psVar1 | bVar4);
  }
  return bVar4;
}

Assistant:

bool grammar::has_empty_production(token_t nonterminal) const {
    if (nonterminal <= 0) return false;

    const auto & rule_list = rules.at(nonterminal);

    // An initial separator = empty production
    bool last_was_sep = true;
    for (const auto & sym : rule_list) {
        if (sym == rule_sep and last_was_sep)
            return true;  // Pipes surrounding nothing = empty production
        else
            last_was_sep = sym == rule_sep;
    }

    // Separator at the end = empty production
    return last_was_sep;
}